

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tgaimage.cpp
# Opt level: O2

bool __thiscall TGAImage::write_tga_file(TGAImage *this,string *filename,bool v_flip,bool rle)

{
  undefined4 uVar1;
  undefined4 uVar2;
  char cVar3;
  bool bVar4;
  ostream *poVar5;
  char *pcVar6;
  undefined1 auVar7 [16];
  uint8_t extension_area_ref [4];
  uint8_t developer_area_ref [4];
  uint8_t footer [18];
  ulong local_240;
  undefined4 local_238;
  undefined4 local_234;
  char local_230;
  char local_22f;
  ofstream out;
  int aiStack_208 [120];
  
  developer_area_ref[0] = '\0';
  developer_area_ref[1] = '\0';
  developer_area_ref[2] = '\0';
  developer_area_ref[3] = '\0';
  extension_area_ref[0] = '\0';
  extension_area_ref[1] = '\0';
  extension_area_ref[2] = '\0';
  extension_area_ref[3] = '\0';
  builtin_memcpy(footer,"TRUEVISION-XFILE.",0x12);
  std::ofstream::ofstream((string *)&out);
  std::ofstream::open((string *)&out,(_Ios_Openmode)filename);
  cVar3 = std::__basic_file<char>::is_open();
  if (cVar3 == '\0') {
    poVar5 = std::operator<<((ostream *)&std::cerr,"can\'t open file ");
    poVar5 = std::operator<<(poVar5,(string *)filename);
    std::operator<<(poVar5,"\n");
    std::ofstream::close();
  }
  else {
    local_238 = 0;
    local_230 = (char)this->bytespp * '\b';
    uVar1 = this->width;
    uVar2 = this->height;
    auVar7._4_4_ = uVar2;
    auVar7._0_4_ = uVar1;
    auVar7._8_8_ = 0;
    auVar7 = pshuflw(auVar7,auVar7,0xe8);
    local_234 = auVar7._0_4_;
    local_240 = (ulong)(byte)(rle * '\b' | this->bytespp == 1) << 0x10 | 0x20000;
    local_22f = !v_flip << 5;
    std::ostream::write((char *)&out,(long)&local_240);
    if (*(int *)((long)aiStack_208 + *(long *)(_out + -0x18)) == 0) {
      if (rle) {
        bVar4 = unload_rle_data(this,&out);
        if (!bVar4) {
          std::ofstream::close();
          pcVar6 = "can\'t unload rle data\n";
          goto LAB_0010422e;
        }
LAB_001042d5:
        std::ostream::write((char *)&out,(long)developer_area_ref);
        pcVar6 = "can\'t dump the tga file\n";
        if (*(int *)((long)aiStack_208 + *(long *)(_out + -0x18)) == 0) {
          std::ostream::write((char *)&out,(long)extension_area_ref);
          if (*(int *)((long)aiStack_208 + *(long *)(_out + -0x18)) == 0) {
            std::ostream::write((char *)&out,(long)footer);
            if (*(int *)((long)aiStack_208 + *(long *)(_out + -0x18)) == 0) {
              bVar4 = true;
              std::ofstream::close();
              goto LAB_0010435d;
            }
          }
        }
      }
      else {
        std::ostream::write((char *)&out,
                            (long)(this->data).
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
        if (*(int *)((long)aiStack_208 + *(long *)(_out + -0x18)) == 0) goto LAB_001042d5;
        pcVar6 = "can\'t unload raw data\n";
      }
      std::operator<<((ostream *)&std::cerr,pcVar6);
      std::ofstream::close();
    }
    else {
      std::ofstream::close();
      pcVar6 = "can\'t dump the tga file\n";
LAB_0010422e:
      std::operator<<((ostream *)&std::cerr,pcVar6);
    }
  }
  bVar4 = false;
LAB_0010435d:
  std::ofstream::~ofstream(&out);
  return bVar4;
}

Assistant:

bool TGAImage::write_tga_file(const std::string filename, const bool v_flip, const bool rle) const
{
    std::uint8_t developer_area_ref[4] = {0, 0, 0, 0};
    std::uint8_t extension_area_ref[4] = {0, 0, 0, 0};
    std::uint8_t footer[18] = {'T', 'R', 'U', 'E', 'V', 'I', 'S', 'I', 'O',
                               'N', '-', 'X', 'F', 'I', 'L', 'E', '.', '\0'};
    std::ofstream out;
    out.open(filename, std::ios::binary);
    if (!out.is_open()) {
        std::cerr << "can't open file " << filename << "\n";
        out.close();
        return false;
    }
    TGA_Header header;
    header.bitsperpixel = bytespp << 3;
    header.width = width;
    header.height = height;
    header.datatypecode = (bytespp == GRAYSCALE ? (rle ? 11 : 3) : (rle ? 10 : 2));
    header.imagedescriptor = v_flip ? 0x00 : 0x20;  // top-left or bottom-left origin
    out.write(reinterpret_cast<const char *>(&header), sizeof(header));
    if (!out.good()) {
        out.close();
        std::cerr << "can't dump the tga file\n";
        return false;
    }
    if (!rle) {
        out.write(reinterpret_cast<const char *>(data.data()), width * height * bytespp);
        if (!out.good()) {
            std::cerr << "can't unload raw data\n";
            out.close();
            return false;
        }
    } else {
        if (!unload_rle_data(out)) {
            out.close();
            std::cerr << "can't unload rle data\n";
            return false;
        }
    }
    out.write(reinterpret_cast<const char *>(developer_area_ref), sizeof(developer_area_ref));
    if (!out.good()) {
        std::cerr << "can't dump the tga file\n";
        out.close();
        return false;
    }
    out.write(reinterpret_cast<const char *>(extension_area_ref), sizeof(extension_area_ref));
    if (!out.good()) {
        std::cerr << "can't dump the tga file\n";
        out.close();
        return false;
    }
    out.write(reinterpret_cast<const char *>(footer), sizeof(footer));
    if (!out.good()) {
        std::cerr << "can't dump the tga file\n";
        out.close();
        return false;
    }
    out.close();
    return true;
}